

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O1

void __thiscall
Js::DebugContext::RegisterFunction
          (DebugContext *this,ParseableFunctionInfo *func,DWORD_PTR dwDebugSourceContext,
          LPCWSTR title)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((this->field_0x1c & 1) == 0) {
    iVar4 = (*(this->scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    bVar2 = (byte)iVar4 ^ 1;
  }
  else {
    bVar2 = 0;
  }
  if (((bVar2 != 0) && (this->hostDebugContext != (HostDebugContext *)0x0)) &&
     (this->debuggerMode != NotDebugging)) {
    if ((func->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_008b543e;
      *puVar5 = 0;
    }
    if ((ParseableFunctionInfo *)
        (((func->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != func) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar3) goto LAB_008b543e;
      *puVar5 = 0;
    }
    if ((((func->super_FunctionProxy).functionInfo.ptr)->attributes & DeferredParse) == None) {
      bVar3 = FunctionProxy::IsFunctionBody(&func->super_FunctionProxy);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar3) {
LAB_008b543e:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    else {
      if (this->scriptContext->threadContext->isScriptActive == true) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                    ,0x6f,
                                    "(!this->scriptContext->GetThreadContext()->IsScriptActive())",
                                    "!this->scriptContext->GetThreadContext()->IsScriptActive()");
        if (!bVar3) goto LAB_008b543e;
        *puVar5 = 0;
      }
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
                 ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                 ExceptionType_OutOfMemory);
      scriptContext = this->scriptContext;
      __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
      __entryExitRecord.scriptContext = (ScriptContext *)0x0;
      __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
      __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
      auStack_98 = (undefined1  [8])0x0;
      __entryExitRecord._0_1_ = 0;
      __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
      __entryExitRecord._2_6_ = 0;
      __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
      EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
                 (ScriptEntryExitRecord *)auStack_98,unaff_retaddr,&stack0x00000000,false,false,
                 false);
      ScriptContext::OnScriptStart(scriptContext,false,true);
      EnterScriptObject::VerifyEnterScript
                ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
      func = &ParseableFunctionInfo::Parse(func,(ScriptFunction **)0x0,false)->
              super_ParseableFunctionInfo;
      EnterScriptObject::~EnterScriptObject
                ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
    }
    RegisterFunction(this,(FunctionBody *)func,dwDebugSourceContext,title);
  }
  return;
}

Assistant:

void DebugContext::RegisterFunction(Js::ParseableFunctionInfo * func, DWORD_PTR dwDebugSourceContext, LPCWSTR title)
    {
        if (!this->CanRegisterFunction())
        {
            return;
        }

        FunctionBody * functionBody = nullptr;
        if (func->IsDeferredParseFunction())
        {
            HRESULT hr = S_OK;
            Assert(!this->scriptContext->GetThreadContext()->IsScriptActive());

            BEGIN_JS_RUNTIME_CALL_EX_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED(this->scriptContext, false)
            {
                functionBody = func->Parse();
            }
            END_JS_RUNTIME_CALL_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT(hr);

            if (FAILED(hr))
            {
                return;
            }
        }
        else
        {
            functionBody = func->GetFunctionBody();
        }
        this->RegisterFunction(functionBody, dwDebugSourceContext, title);
    }